

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O1

bool __thiscall
stream::lzma_decompressor_impl_base::filter
          (lzma_decompressor_impl_base *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  undefined8 *puVar1;
  uint uVar2;
  string *psVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = (undefined8 *)this->stream;
  *puVar1 = *begin_in;
  puVar1[1] = (long)end_in - (long)*begin_in;
  puVar1[3] = *begin_out;
  puVar1[4] = (long)end_out - (long)*begin_out;
  uVar2 = lzma_code(puVar1,0);
  if ((uVar2 == 10 && flush) && (puVar1[4] != 0)) {
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,"truncated lzma stream","");
    std::ios_base::failure[abi:cxx11]::failure(psVar3);
    *(undefined ***)psVar3 = &PTR__failure_00173700;
    *(undefined4 *)(psVar3 + 0x20) = 10;
    __cxa_throw(psVar3,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  *begin_in = (char *)*puVar1;
  *begin_out = (char *)puVar1[3];
  if ((1 < uVar2) && (uVar2 != 10)) {
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,"lzma decrompression error","");
    std::ios_base::failure[abi:cxx11]::failure(psVar3);
    *(undefined ***)psVar3 = &PTR__failure_00173700;
    *(uint *)(psVar3 + 0x20) = uVar2;
    __cxa_throw(psVar3,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  return uVar2 != 1;
}

Assistant:

bool lzma_decompressor_impl_base::filter(const char * & begin_in, const char * end_in,
                                         char * & begin_out, char * end_out, bool flush) {
	
	lzma_stream * strm = static_cast<lzma_stream *>(stream);
	
	strm->next_in = reinterpret_cast<const boost::uint8_t *>(begin_in);
	strm->avail_in = size_t(end_in - begin_in);
	
	strm->next_out = reinterpret_cast<boost::uint8_t *>(begin_out);
	strm->avail_out = size_t(end_out - begin_out);
	
	lzma_ret ret = lzma_code(strm, LZMA_RUN);
	
	if(flush && ret == LZMA_BUF_ERROR && strm->avail_out > 0) {
		throw lzma_error("truncated lzma stream", ret);
	}
	
	begin_in = reinterpret_cast<const char *>(strm->next_in);
	begin_out = reinterpret_cast<char *>(strm->next_out);
	
	if(ret != LZMA_OK && ret != LZMA_STREAM_END && ret != LZMA_BUF_ERROR) {
		throw lzma_error("lzma decrompression error", ret);
	}
	
	return (ret != LZMA_STREAM_END);
}